

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O1

int coda_ascbin_cursor_goto_available_union_field(coda_cursor *cursor)

{
  int iVar1;
  int iVar2;
  long in_RAX;
  coda_type *pcVar3;
  long index;
  long local_18;
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  if (pcVar3[1].attributes == (coda_type_record *)0x0) {
    coda_set_error(-0x69,"cursor does not refer to a union");
    iVar2 = -1;
  }
  else {
    local_18 = in_RAX;
    iVar1 = coda_ascbin_cursor_get_available_union_field_index(cursor,&local_18);
    iVar2 = -1;
    if (iVar1 == 0) {
      iVar2 = cursor->n;
      cursor->n = iVar2 + 1;
      cursor->stack[iVar2].type =
           *(coda_dynamic_type_struct **)(*(long *)(pcVar3[1].description + local_18 * 8) + 0x10);
      cursor->stack[iVar2].index = local_18;
      cursor->stack[iVar2].bit_offset = cursor->stack[(long)iVar2 + -1].bit_offset;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int coda_ascbin_cursor_goto_available_union_field(coda_cursor *cursor)
{
    coda_type_record *record;
    long index;

    record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    if (record->union_field_expr == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_TYPE, "cursor does not refer to a union");
        return -1;
    }

    if (coda_ascbin_cursor_get_available_union_field_index(cursor, &index) != 0)
    {
        return -1;
    }

    cursor->n++;
    cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)record->field[index]->type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = cursor->stack[cursor->n - 2].bit_offset;

    return 0;
}